

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7c624::IntrusiveListIteratorTest::~IntrusiveListIteratorTest
          (IntrusiveListIteratorTest *this)

{
  TestObject *pTVar1;
  TestObject *pTVar2;
  
  (this->super_IntrusiveListTest).super_Test._vptr_Test =
       (_func_int **)&PTR__IntrusiveListIteratorTest_002cfa70;
  pTVar2 = (this->list_).first_;
  while (pTVar2 != (TestObject *)0x0) {
    if (pTVar2->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar2);
    pTVar2 = pTVar1;
  }
  (this->list_).first_ = (TestObject *)0x0;
  (this->list_).last_ = (TestObject *)0x0;
  (this->list_).size_ = 0;
  testing::Test::~Test((Test *)this);
  return;
}

Assistant:

virtual void SetUp() {
    IntrusiveListTest::SetUp();

    list_.emplace_back(1);
    list_.emplace_back(2);
    list_.emplace_back(3);
  }